

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::TrackRegisterPropertyForDebugger
          (ByteCodeGenerator *this,DebuggerScope *debuggerScope,Symbol *symbol,FuncInfo *funcInfo,
          DebuggerScopePropertyFlags flags,bool isFunctionDeclaration)

{
  code *pcVar1;
  bool bVar2;
  RegSlot location_00;
  PropertyId propertyId_00;
  undefined4 *puVar3;
  ByteCodeWriter *pBVar4;
  FunctionBody *pFVar5;
  FunctionBody *byteCodeFunction;
  DebuggerScope *pDStack_40;
  PropertyId propertyId;
  DebuggerScope *correctDebuggerScope;
  RegSlot location;
  bool isFunctionDeclaration_local;
  DebuggerScopePropertyFlags flags_local;
  FuncInfo *funcInfo_local;
  Symbol *symbol_local;
  DebuggerScope *debuggerScope_local;
  ByteCodeGenerator *this_local;
  
  if (debuggerScope == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x143,"(debuggerScope)","debuggerScope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (symbol == (Symbol *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x144,"(symbol)","symbol");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (funcInfo == (FuncInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x145,"(funcInfo)","funcInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  location_00 = Symbol::GetLocation(symbol);
  pDStack_40 = debuggerScope;
  if ((debuggerScope->scopeType != DiagBlockScopeDirect) &&
     (debuggerScope->scopeType != DiagCatchScopeDirect)) {
    pBVar4 = Writer(this);
    pFVar5 = Js::ByteCodeWriter::GetFunctionWrite(pBVar4);
    pDStack_40 = Js::DebuggerScope::GetSiblingScope(debuggerScope,location_00,pFVar5);
  }
  bVar2 = ShouldTrackDebuggerMetadata(this);
  if ((bVar2) && (bVar2 = Symbol::GetIsTrackedForDebugger(symbol), !bVar2)) {
    propertyId_00 = Symbol::EnsurePosition(symbol,this);
    pBVar4 = Writer(this);
    Js::ByteCodeWriter::AddPropertyToDebuggerScope
              (pBVar4,pDStack_40,location_00,propertyId_00,true,flags,isFunctionDeclaration);
    pFVar5 = FuncInfo::GetParsedFunctionBody(funcInfo);
    Js::FunctionBody::InsertSymbolToRegSlotList
              (pFVar5,location_00,propertyId_00,funcInfo->varRegsCount);
    Symbol::SetIsTrackedForDebugger(symbol,true);
  }
  return;
}

Assistant:

void ByteCodeGenerator::TrackRegisterPropertyForDebugger(
    Js::DebuggerScope *debuggerScope,
    Symbol *symbol,
    FuncInfo *funcInfo,
    Js::DebuggerScopePropertyFlags flags /*= Js::DebuggerScopePropertyFlags_None*/,
    bool isFunctionDeclaration /*= false*/)
{
    Assert(debuggerScope);
    Assert(symbol);
    Assert(funcInfo);

    Js::RegSlot location = symbol->GetLocation();

    Js::DebuggerScope *correctDebuggerScope = debuggerScope;
    if (debuggerScope->scopeType != Js::DiagExtraScopesType::DiagBlockScopeDirect && debuggerScope->scopeType != Js::DiagExtraScopesType::DiagCatchScopeDirect)
    {
        // We have to get the appropriate scope and add property over there.
        // Make sure the scope is created whether we're in debug mode or not, because we
        // need the empty scopes present during reparsing for debug mode.
        correctDebuggerScope = debuggerScope->GetSiblingScope(location, Writer()->GetFunctionWrite());
    }

    if (this->ShouldTrackDebuggerMetadata() && !symbol->GetIsTrackedForDebugger())
    {
        // Only track the property if we're in debug mode since it's only needed by the debugger.
        Js::PropertyId propertyId = symbol->EnsurePosition(this);

        this->Writer()->AddPropertyToDebuggerScope(
            correctDebuggerScope,
            location,
            propertyId,
            /*shouldConsumeRegister*/ true,
            flags,
            isFunctionDeclaration);

        Js::FunctionBody *byteCodeFunction = funcInfo->GetParsedFunctionBody();
        byteCodeFunction->InsertSymbolToRegSlotList(location, propertyId, funcInfo->varRegsCount);

        symbol->SetIsTrackedForDebugger(true);
    }
}